

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualStack.cpp
# Opt level: O0

void __thiscall VirtualStack::VirtualStack(VirtualStack *this)

{
  Variable *local_50;
  allocator local_41;
  string local_40 [48];
  VirtualStack *local_10;
  VirtualStack *this_local;
  
  this->_vptr_VirtualStack = (_func_int **)&PTR__VirtualStack_0012dd80;
  local_50 = this->stack;
  local_10 = this;
  do {
    Variable::Variable(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (Variable *)&this->stackOffset);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  Variable::Variable(&this->errorDefault,(string *)local_40,INT);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Parser::Parser(&this->parser);
  this->stackOffset = 0;
  return;
}

Assistant:

VirtualStack::VirtualStack()
: errorDefault("", DataType::INT)
{
    //ctor
    stackOffset = 0;
}